

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O0

void SN76489_Update(SN76489_Context *chip,UINT32 length,DEV_SMPL **buffer)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  bool local_4d;
  uint local_44;
  UINT32 Feedback;
  int chnOut_1;
  int chnOut;
  SN76489_Context *chip_n;
  SN76489_Context *chip_t;
  UINT32 j;
  UINT32 i;
  DEV_SMPL **buffer_local;
  UINT32 length_local;
  SN76489_Context *chip_local;
  
  _chnOut_1 = chip;
  chip_n = chip;
  if (chip->NgpFlags != '\0') {
    if ((chip->NgpFlags & 1) == 0) {
      _chnOut_1 = chip->NgpChip2;
    }
    else {
      chip_n = chip->NgpChip2;
    }
  }
  for (chip_t._0_4_ = 0; (uint)chip_t < length; chip_t._0_4_ = (uint)chip_t + 1) {
    for (chip_t._4_4_ = 0; chip_t._4_4_ < 3; chip_t._4_4_ = chip_t._4_4_ + 1) {
      if (((int)(uint)chip_n->Mute >> ((byte)chip_t._4_4_ & 0x1f) & 1U) == 0) {
        chip->ChannelState[chip_t._4_4_] = 0.0;
      }
      else if ((chip_n->IntermediatePos[chip_t._4_4_] != 1.1754944e-38) ||
              (NAN(chip_n->IntermediatePos[chip_t._4_4_]))) {
        chip->ChannelState[chip_t._4_4_] = chip_n->IntermediatePos[chip_t._4_4_];
      }
      else {
        chip->ChannelState[chip_t._4_4_] = (float)chip_n->ToneFreqPos[chip_t._4_4_];
      }
    }
    if (((int)(uint)chip_n->Mute >> 3 & 1U) == 0) {
      chip->ChannelState[3] = 0.0;
    }
    else {
      chip->ChannelState[3] = (float)(int)((_chnOut_1->NoiseShiftRegister & 1) * 2 + -1);
      if ((_chnOut_1->Registers[6] & 4) != 0) {
        chip->ChannelState[3] = chip->ChannelState[3] / 2.0;
      }
    }
    (*buffer)[(uint)chip_t] = 0;
    buffer[1][(uint)chip_t] = 0;
    if (chip->NgpFlags == '\0') {
      for (chip_t._4_4_ = 0; chip_t._4_4_ < 4; chip_t._4_4_ = chip_t._4_4_ + 1) {
        iVar1 = (int)((float)PSGVolumeValues[chip->Registers[chip_t._4_4_ * 2 + 1]] *
                     chip->ChannelState[chip_t._4_4_]);
        bVar3 = (byte)chip_t._4_4_;
        if (((int)(uint)chip->PSGStereo >> (bVar3 & 0x1f) & 0x11U) == 0x11) {
          (*buffer)[(uint)chip_t] =
               (iVar1 * chip->panning[chip_t._4_4_][0] >> 0x10) + (*buffer)[(uint)chip_t];
          buffer[1][(uint)chip_t] =
               (iVar1 * chip->panning[chip_t._4_4_][1] >> 0x10) + buffer[1][(uint)chip_t];
        }
        else {
          (*buffer)[(uint)chip_t] =
               ((int)(uint)chip->PSGStereo >> (bVar3 + 4 & 0x1f) & 1U) * iVar1 +
               (*buffer)[(uint)chip_t];
          buffer[1][(uint)chip_t] =
               ((int)(uint)chip->PSGStereo >> (bVar3 & 0x1f) & 1U) * iVar1 + buffer[1][(uint)chip_t]
          ;
        }
      }
    }
    else if ((chip->NgpFlags & 1) == 0) {
      for (chip_t._4_4_ = 0; chip_t._4_4_ < 3; chip_t._4_4_ = chip_t._4_4_ + 1) {
        (*buffer)[(uint)chip_t] =
             ((int)(uint)chip->PSGStereo >> ((byte)chip_t._4_4_ + 4 & 0x1f) & 1U) *
             (int)((float)PSGVolumeValues[chip_n->Registers[chip_t._4_4_ * 2 + 1]] *
                  chip->ChannelState[chip_t._4_4_]) + (*buffer)[(uint)chip_t];
        buffer[1][(uint)chip_t] =
             ((int)(uint)chip->PSGStereo >> ((byte)chip_t._4_4_ & 0x1f) & 1U) *
             (int)((float)PSGVolumeValues[_chnOut_1->Registers[chip_t._4_4_ * 2 + 1]] *
                  chip->ChannelState[chip_t._4_4_]) + buffer[1][(uint)chip_t];
      }
    }
    else {
      (*buffer)[(uint)chip_t] =
           ((int)(uint)chip->PSGStereo >> 7) *
           (int)((float)PSGVolumeValues[chip_n->Registers[7]] * chip->ChannelState[3]) +
           (*buffer)[(uint)chip_t];
      buffer[1][(uint)chip_t] =
           ((int)(uint)chip->PSGStereo >> 3 & 1U) *
           (int)((float)PSGVolumeValues[_chnOut_1->Registers[7]] * chip->ChannelState[3]) +
           buffer[1][(uint)chip_t];
    }
    chip->Clock = chip->Clock + chip->dClock;
    chip->NumClocksForSample = (UINT32)(long)chip->Clock;
    chip->Clock = chip->Clock - (float)chip->NumClocksForSample;
    for (chip_t._4_4_ = 0; chip_t._4_4_ < 3; chip_t._4_4_ = chip_t._4_4_ + 1) {
      chip->ToneFreqVals[chip_t._4_4_] = chip->ToneFreqVals[chip_t._4_4_] - chip->NumClocksForSample
      ;
    }
    if (chip->NoiseFreq == 0x80) {
      chip->ToneFreqVals[3] = chip->ToneFreqVals[2];
    }
    else {
      chip->ToneFreqVals[3] = chip->ToneFreqVals[3] - chip->NumClocksForSample;
    }
    for (chip_t._4_4_ = 0; chip_t._4_4_ < 3; chip_t._4_4_ = chip_t._4_4_ + 1) {
      if (chip->ToneFreqVals[chip_t._4_4_] < 1) {
        if (chip->Registers[chip_t._4_4_ << 1] < 6) {
          chip->ToneFreqPos[chip_t._4_4_] = 1;
          chip->IntermediatePos[chip_t._4_4_] = 1.1754944e-38;
        }
        else {
          chip->IntermediatePos[chip_t._4_4_] =
               ((((float)chip->NumClocksForSample - chip->Clock) +
                (float)(chip->ToneFreqVals[chip_t._4_4_] * 2)) *
               (float)chip->ToneFreqPos[chip_t._4_4_]) /
               ((float)chip->NumClocksForSample + chip->Clock);
          chip->ToneFreqPos[chip_t._4_4_] = -chip->ToneFreqPos[chip_t._4_4_];
        }
        chip->ToneFreqVals[chip_t._4_4_] =
             (uint)chip->Registers[chip_t._4_4_ << 1] *
             (chip->NumClocksForSample / (uint)chip->Registers[chip_t._4_4_ << 1] + 1) +
             chip->ToneFreqVals[chip_t._4_4_];
      }
      else {
        chip->IntermediatePos[chip_t._4_4_] = 1.1754944e-38;
      }
    }
    if (chip->ToneFreqVals[3] < 1) {
      chip->ToneFreqPos[3] = -chip->ToneFreqPos[3];
      if (chip->NoiseFreq != 0x80) {
        chip->ToneFreqVals[3] =
             (uint)chip->NoiseFreq * (chip->NumClocksForSample / (uint)chip->NoiseFreq + 1) +
             chip->ToneFreqVals[3];
      }
      if (chip->ToneFreqPos[3] == 1) {
        if ((chip->Registers[6] & 4) == 0) {
          local_44 = chip->NoiseShiftRegister & 1;
        }
        else if ((chip->WhiteNoiseFeedback == 3) || (chip->WhiteNoiseFeedback == 9)) {
          local_4d = false;
          if ((chip->NoiseShiftRegister & chip->WhiteNoiseFeedback) != 0) {
            local_4d = (chip->NoiseShiftRegister & chip->WhiteNoiseFeedback) !=
                       chip->WhiteNoiseFeedback;
          }
          local_44 = (uint)local_4d;
        }
        else {
          uVar2 = chip->NoiseShiftRegister & chip->WhiteNoiseFeedback;
          uVar2 = uVar2 >> 8 ^ uVar2;
          uVar2 = uVar2 >> 4 ^ uVar2;
          uVar2 = uVar2 >> 2 ^ uVar2;
          local_44 = (uVar2 >> 1 ^ uVar2) & 1;
        }
        chip->NoiseShiftRegister =
             chip->NoiseShiftRegister >> 1 | local_44 << (chip->SRWidth - 1 & 0x1f);
      }
    }
  }
  return;
}

Assistant:

static void SN76489_Update(SN76489_Context* chip, UINT32 length, DEV_SMPL **buffer)
{
	UINT32 i, j;
	SN76489_Context* chip_t;
	SN76489_Context* chip_n;
	
	if (! chip->NgpFlags)
	{
		chip_t = chip_n = chip;
	}
	else
	{
		if (! (chip->NgpFlags & 0x01))
		{
			chip_t = chip;
			chip_n = chip->NgpChip2;
		}
		else
		{
			chip_t = chip->NgpChip2;
			chip_n = chip;
		}
	}
	
	for( j = 0; j < length; j++ )
	{
		/* Tone channels */
		for ( i = 0; i <= 2; ++i )
			if ( (chip_t->Mute >> i) & 1 )
			{
				if ( chip_t->IntermediatePos[i] != FLT_MIN )
					/* Intermediate position (antialiasing) */
					chip->ChannelState[i] = chip_t->IntermediatePos[i];
				else
					/* Flat (no antialiasing needed) */
					chip->ChannelState[i] = (float)chip_t->ToneFreqPos[i];
			}
			else
				/* Muted channel */
				chip->ChannelState[i] = 0.0f;

		/* Noise channel */
		if ( (chip_t->Mute >> 3) & 1 )
		{
			//chip->Channels[3] = PSGVolumeValues[chip->Registers[7]] * ( chip_n->NoiseShiftRegister & 0x1 ) * 2; /* double noise volume */
			// Now the noise is bipolar, too. -Valley Bell
			chip->ChannelState[3] = (float)( (int)( chip_n->NoiseShiftRegister & 0x1 ) * 2 - 1 );
			// due to the way the white noise works here, it seems twice as loud as it should be
			if (chip_n->Registers[6] & 0x4 )
				chip->ChannelState[3] /= 2.0f;
		}
		else
			chip->ChannelState[3] = 0.0f;

		// Build stereo result into buffer
		buffer[0][j] = 0;
		buffer[1][j] = 0;
		if (! chip->NgpFlags)
		{
			// For all 4 channels
			for ( i = 0; i <= 3; ++i )
			{
				int chnOut = (int)(PSGVolumeValues[chip->Registers[2 * i + 1]] * chip->ChannelState[i]);
				if ( ( ( chip->PSGStereo >> i ) & 0x11 ) == 0x11 )
				{
					// no GG stereo for this channel
					buffer[0][j] += APPLY_PANNING( chnOut, chip->panning[i][0] ); // left
					buffer[1][j] += APPLY_PANNING( chnOut, chip->panning[i][1] ); // right
				}
				else
				{
					// GG stereo overrides panning
					buffer[0][j] += ( chip->PSGStereo >> (i+4) & 0x1 ) * chnOut; // left
					buffer[1][j] += ( chip->PSGStereo >>  i    & 0x1 ) * chnOut; // right
				}
			}
		}
		else
		{
			int chnOut;
			if (! (chip->NgpFlags & 0x01))
			{
				// For all 3 tone channels
				for (i = 0; i < 3; i ++)
				{
					chnOut = (int)(PSGVolumeValues[chip_t->Registers[2 * i + 1]] * chip->ChannelState[i]);
					buffer[0][j] += (chip->PSGStereo >> (i+4) & 0x1 ) * chnOut; // left
					chnOut = (int)(PSGVolumeValues[chip_n->Registers[2 * i + 1]] * chip->ChannelState[i]);
					buffer[1][j] += (chip->PSGStereo >>  i    & 0x1 ) * chnOut; // right
				}
			}
			else
			{
				// noise channel
				i = 3;
				chnOut = (int)(PSGVolumeValues[chip_t->Registers[2 * i + 1]] * chip->ChannelState[i]);
				buffer[0][j] += (chip->PSGStereo >> (i+4) & 0x1 ) * chnOut; // left
				chnOut = (int)(PSGVolumeValues[chip_n->Registers[2 * i + 1]] * chip->ChannelState[i]);
				buffer[1][j] += (chip->PSGStereo >>  i    & 0x1 ) * chnOut; // right
			}
		}

		/* Increment clock by 1 sample length */
		chip->Clock += chip->dClock;
		chip->NumClocksForSample = (UINT32)chip->Clock;   /* truncate */
		chip->Clock -= chip->NumClocksForSample;      /* remove integer part */
	
		/* Decrement tone channel counters */
		for ( i = 0; i <= 2; ++i )
			chip->ToneFreqVals[i] -= chip->NumClocksForSample;
	 
		/* Noise channel: match to tone2 or decrement its counter */
		if ( chip->NoiseFreq == 0x80 )
			chip->ToneFreqVals[3] = chip->ToneFreqVals[2];
		else
			chip->ToneFreqVals[3] -= chip->NumClocksForSample;
	
		/* Tone channels: */
		for ( i = 0; i <= 2; ++i ) {
			if ( chip->ToneFreqVals[i] <= 0 ) {   /* If the counter gets below 0... */
				if (chip->Registers[i*2]>=PSG_CUTOFF) {
					/* For tone-generating values, calculate how much of the sample is + and how much is - */
					/* This is optimised into an even more confusing state than it was in the first place... */
					chip->IntermediatePos[i] = ( chip->NumClocksForSample - chip->Clock + 2 * chip->ToneFreqVals[i] ) * chip->ToneFreqPos[i] / ( chip->NumClocksForSample + chip->Clock );
					/* Flip the flip-flop */
					chip->ToneFreqPos[i] = -chip->ToneFreqPos[i];
				} else {
					/* stuck value */
					chip->ToneFreqPos[i] = 1;
					chip->IntermediatePos[i] = FLT_MIN;
				}
				chip->ToneFreqVals[i] += chip->Registers[i*2] * ( chip->NumClocksForSample / chip->Registers[i*2] + 1 );
			}
			else
				/* signal no antialiasing needed */
				chip->IntermediatePos[i] = FLT_MIN;
		}
	
		/* Noise channel */
		if ( chip->ToneFreqVals[3] <= 0 ) {
			/* If the counter gets below 0... */
			/* Flip the flip-flop */
			chip->ToneFreqPos[3] = -chip->ToneFreqPos[3];
			if (chip->NoiseFreq != 0x80)
				/* If not matching tone2, decrement counter */
				chip->ToneFreqVals[3] += chip->NoiseFreq * ( chip->NumClocksForSample / chip->NoiseFreq + 1 );
			if (chip->ToneFreqPos[3] == 1) {
				/* On the positive edge of the square wave (only once per cycle) */
				UINT32 Feedback;
				if ( chip->Registers[6] & 0x4 ) {
					/* White noise */
					/* Calculate parity of fed-back bits for feedback */
					switch (chip->WhiteNoiseFeedback) {
						/* Do some optimised calculations for common (known) feedback values */
					case 0x0003: /* SC-3000, BBC %00000011 */
					case 0x0009: /* SMS, GG, MD  %00001001 */
						/* If two bits fed back, I can do Feedback=(nsr & fb) && (nsr & fb ^ fb) */
						/* since that's (one or more bits set) && (not all bits set) */
						Feedback = ( ( chip->NoiseShiftRegister & chip->WhiteNoiseFeedback )
							&& ( (chip->NoiseShiftRegister & chip->WhiteNoiseFeedback ) ^ chip->WhiteNoiseFeedback ) );
						break;
					default:
						/* Default handler for all other feedback values */
						/* XOR fold bits into the final bit */
						Feedback = chip->NoiseShiftRegister & chip->WhiteNoiseFeedback;
						Feedback ^= Feedback >> 8;
						Feedback ^= Feedback >> 4;
						Feedback ^= Feedback >> 2;
						Feedback ^= Feedback >> 1;
						Feedback &= 1;
						break;
					}
				} else	  /* Periodic noise */
					Feedback=chip->NoiseShiftRegister&1;

				chip->NoiseShiftRegister=(chip->NoiseShiftRegister>>1) | (Feedback << (chip->SRWidth-1));
			}
		}
	}
}